

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void printTo<int>(FILE *fp,String *fmtstr,int *args)

{
  char *pcVar1;
  String local_40;
  int *local_20;
  int *args_local;
  String *fmtstr_local;
  FILE *fp_local;
  
  local_20 = args;
  args_local = (int *)fmtstr;
  fmtstr_local = (String *)fp;
  format<int>(&local_40,fmtstr,args);
  pcVar1 = String::c_str(&local_40);
  fprintf((FILE *)fp,"%s",pcVar1);
  String::~String(&local_40);
  return;
}

Assistant:

void printTo (FILE* fp, const String& fmtstr, const argtypes&... args)
{
	fprintf (fp, "%s", format (fmtstr, args...).c_str());
}